

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O3

void basisu::etc_block::get_diff_subblock_colors
               (color_rgba *pDst,uint16_t packed_color5,uint32_t table_idx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  uint8_t uVar8;
  uint uVar9;
  uint uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  
  if (table_idx < 8) {
    lVar6 = (ulong)table_idx * 0x10;
    iVar1 = (packed_color5 >> 2 & 7) + (packed_color5 & 0x1f) * 8;
    uVar4 = packed_color5 >> 2 & 0xf8 | packed_color5 >> 7 & 7;
    uVar7 = packed_color5 >> 7 & 0xf8 | packed_color5 >> 0xc & 7;
    iVar2 = *(int *)(g_etc1_inten_tables + lVar6);
    iVar3 = *(int *)(g_etc1_inten_tables + lVar6 + 4);
    uVar10 = iVar2 + uVar7;
    uVar5 = iVar2 + uVar4;
    uVar9 = iVar2 + iVar1;
    uVar12 = 0xff;
    if (uVar10 < 0xff) {
      uVar12 = (uint8_t)uVar10;
    }
    uVar11 = '\0';
    if ((int)uVar10 < 0) {
      uVar12 = uVar11;
    }
    uVar8 = 0xff;
    if (uVar5 < 0xff) {
      uVar8 = (uint8_t)uVar5;
    }
    (pDst->field_0).m_comps[0] = uVar12;
    if ((int)uVar5 < 0) {
      uVar8 = uVar11;
    }
    uVar10 = 0xff;
    if (uVar9 < 0xff) {
      uVar10 = uVar9;
    }
    (pDst->field_0).m_comps[1] = uVar8;
    uVar12 = (uint8_t)uVar10;
    if ((int)uVar9 < 0) {
      uVar12 = uVar11;
    }
    (pDst->field_0).m_comps[2] = uVar12;
    uVar10 = iVar3 + uVar7;
    uVar5 = iVar3 + uVar4;
    uVar9 = iVar3 + iVar1;
    uVar12 = 0xff;
    if (uVar10 < 0xff) {
      uVar12 = (uint8_t)uVar10;
    }
    if ((int)uVar10 < 0) {
      uVar12 = uVar11;
    }
    uVar8 = 0xff;
    if (uVar5 < 0xff) {
      uVar8 = (uint8_t)uVar5;
    }
    (pDst->field_0).m_comps[3] = 0xff;
    if ((int)uVar5 < 0) {
      uVar8 = uVar11;
    }
    uVar10 = 0xff;
    if (uVar9 < 0xff) {
      uVar10 = uVar9;
    }
    pDst[1].field_0.m_comps[0] = uVar12;
    uVar12 = (uint8_t)uVar10;
    if ((int)uVar9 < 0) {
      uVar12 = '\0';
    }
    pDst[1].field_0.m_comps[1] = uVar8;
    pDst[1].field_0.m_comps[2] = uVar12;
    pDst[1].field_0.m_comps[3] = 0xff;
    iVar2 = *(int *)(g_etc1_inten_tables + lVar6 + 8);
    uVar10 = iVar2 + uVar7;
    uVar5 = iVar2 + uVar4;
    uVar9 = iVar2 + iVar1;
    uVar12 = 0xff;
    if (uVar10 < 0xff) {
      uVar12 = (uint8_t)uVar10;
    }
    if ((int)uVar10 < 0) {
      uVar12 = uVar11;
    }
    pDst[2].field_0.m_comps[0] = uVar12;
    uVar12 = 0xff;
    if (uVar5 < 0xff) {
      uVar12 = (uint8_t)uVar5;
    }
    if ((int)uVar5 < 0) {
      uVar12 = uVar11;
    }
    pDst[2].field_0.m_comps[1] = uVar12;
    uVar10 = 0xff;
    if (uVar9 < 0xff) {
      uVar10 = uVar9;
    }
    uVar12 = (uint8_t)uVar10;
    if ((int)uVar9 < 0) {
      uVar12 = uVar11;
    }
    pDst[2].field_0.m_comps[2] = uVar12;
    pDst[2].field_0.m_comps[3] = 0xff;
    iVar2 = *(int *)(g_etc1_inten_tables + lVar6 + 0xc);
    uVar7 = uVar7 + iVar2;
    uVar4 = uVar4 + iVar2;
    uVar5 = iVar2 + iVar1;
    uVar10 = 0xff;
    if (uVar7 < 0xff) {
      uVar10 = uVar7;
    }
    uVar12 = (uint8_t)uVar10;
    if ((int)uVar7 < 0) {
      uVar12 = uVar11;
    }
    pDst[3].field_0.m_comps[0] = uVar12;
    uVar10 = 0xff;
    if (uVar4 < 0xff) {
      uVar10 = uVar4;
    }
    uVar12 = (uint8_t)uVar10;
    if ((int)uVar4 < 0) {
      uVar12 = uVar11;
    }
    pDst[3].field_0.m_comps[1] = uVar12;
    uVar10 = 0xff;
    if (uVar5 < 0xff) {
      uVar10 = uVar5;
    }
    uVar12 = (uint8_t)uVar10;
    if ((int)uVar5 < 0) {
      uVar12 = uVar11;
    }
    pDst[3].field_0.m_comps[2] = uVar12;
    pDst[3].field_0.m_comps[3] = 0xff;
    return;
  }
  __assert_fail("table_idx < cETC1IntenModifierValues",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.cpp"
                ,0x217,
                "static void basisu::etc_block::get_diff_subblock_colors(color_rgba *, uint16_t, uint32_t)"
               );
}

Assistant:

void etc_block::get_diff_subblock_colors(color_rgba* pDst, uint16_t packed_color5, uint32_t table_idx)
	{
		assert(table_idx < cETC1IntenModifierValues);
		const int *pInten_modifer_table = &g_etc1_inten_tables[table_idx][0];

		uint32_t r, g, b;
		unpack_color5(r, g, b, packed_color5, true);

		const int ir = static_cast<int>(r), ig = static_cast<int>(g), ib = static_cast<int>(b);

		const int y0 = pInten_modifer_table[0];
		pDst[0].set(ir + y0, ig + y0, ib + y0, 255);

		const int y1 = pInten_modifer_table[1];
		pDst[1].set(ir + y1, ig + y1, ib + y1, 255);

		const int y2 = pInten_modifer_table[2];
		pDst[2].set(ir + y2, ig + y2, ib + y2, 255);

		const int y3 = pInten_modifer_table[3];
		pDst[3].set(ir + y3, ig + y3, ib + y3, 255);
	}